

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O2

void Llb_Nonlin4VerifyScores(Llb_Mgr_t_conflict *p)

{
  Llb_Prt_t *pLVar1;
  Llb_Var_t *pLVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  for (lVar6 = 0; lVar6 < p->iPartFree; lVar6 = lVar6 + 1) {
    pLVar1 = p->pParts[lVar6];
    if (pLVar1 != (Llb_Prt_t *)0x0) {
      iVar5 = pLVar1->nSize;
      iVar3 = Cudd_DagSize(pLVar1->bFunc);
      if (iVar5 != iVar3) {
        __assert_fail("pPart->nSize == Cudd_DagSize(pPart->bFunc)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb4Image.c"
                      ,0x29f,"void Llb_Nonlin4VerifyScores(Llb_Mgr_t *)");
      }
    }
  }
  lVar6 = 0;
  do {
    if (p->nVars <= lVar6) {
      return;
    }
    pLVar2 = p->pVars[lVar6];
    if (pLVar2 != (Llb_Var_t *)0x0) {
      iVar5 = 0;
      iVar3 = 0;
      while( true ) {
        if (pLVar2->vParts->nSize <= iVar5) break;
        iVar4 = Vec_IntEntry(pLVar2->vParts,iVar5);
        iVar3 = iVar3 + p->pParts[iVar4]->nSize;
        iVar5 = iVar5 + 1;
      }
      if (iVar3 != pLVar2->nScore) {
        __assert_fail("nScore == pVar->nScore",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb4Image.c"
                      ,0x2a5,"void Llb_Nonlin4VerifyScores(Llb_Mgr_t *)");
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void Llb_Nonlin4VerifyScores( Llb_Mgr_t * p )
{
    Llb_Prt_t * pPart;
    Llb_Var_t * pVar;
    int i, k, nScore;
    Llb_MgrForEachPart( p, pPart, i )
        assert( pPart->nSize == Cudd_DagSize(pPart->bFunc) );
    Llb_MgrForEachVar( p, pVar, i )
    {
        nScore = 0;
        Llb_VarForEachPart( p, pVar, pPart, k )
            nScore += pPart->nSize;
        assert( nScore == pVar->nScore );
    }
}